

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestNative.cpp
# Opt level: O2

Variant * MemberFunction(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters params)

{
  TestClass *pTVar1;
  any local_20;
  
  (*((script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_IScript
    [8])(&local_20);
  pTVar1 = std::any_cast<TestClass*>(&local_20);
  std::any::reset(&local_20);
  Jinx::Variant::Variant(__return_storage_ptr__,pTVar1->m_testValue);
  return __return_storage_ptr__;
}

Assistant:

static Variant MemberFunction(ScriptPtr script, Parameters params)
{
	TestClass * testClass = JinxAnyCast<TestClass *>(script->GetUserContext());
	return testClass->GetTestValue();
}